

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void sortOpts(StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *OptMap,
             SmallVectorImpl<std::pair<const_char_*,_llvm::cl::Option_*>_> *Opts,bool ShowHidden)

{
  pair<const_char_*,_llvm::cl::Option_*> *Start;
  void *pvVar1;
  bool bVar2;
  OptionHidden OVar3;
  StringMapEntry<llvm::cl::Option_*> *pSVar4;
  size_t sVar5;
  StringRef SVar6;
  char *local_1b0;
  char *local_1a0;
  pair<const_char_*,_llvm::cl::Option_*> local_198;
  pair<llvm::SmallPtrSetIterator<llvm::cl::Option_*>,_bool> local_188;
  StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
  local_170;
  iterator E;
  iterator I;
  SmallPtrSet<llvm::cl::Option_*,_32U> OptionSet;
  bool ShowHidden_local;
  SmallVectorImpl<std::pair<const_char_*,_llvm::cl::Option_*>_> *Opts_local;
  StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *OptMap_local;
  
  llvm::SmallPtrSet<llvm::cl::Option_*,_32U>::SmallPtrSet
            ((SmallPtrSet<llvm::cl::Option_*,_32U> *)&I);
  E = llvm::StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::begin(OptMap);
  local_170.Ptr =
       (StringMapEntryBase **)
       llvm::StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::end(OptMap);
  while (bVar2 = llvm::
                 iterator_facade_base<llvm::StringMapIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_llvm::StringMapEntry<llvm::cl::Option_*>_*,_llvm::StringMapEntry<llvm::cl::Option_*>_&>
                 ::operator!=((iterator_facade_base<llvm::StringMapIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_llvm::StringMapEntry<llvm::cl::Option_*>_*,_llvm::StringMapEntry<llvm::cl::Option_*>_&>
                               *)&E,(StringMapIterator<llvm::cl::Option_*> *)&local_170), bVar2) {
    pSVar4 = llvm::
             iterator_facade_base<llvm::StringMapIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_llvm::StringMapEntry<llvm::cl::Option_*>_*,_llvm::StringMapEntry<llvm::cl::Option_*>_&>
             ::operator->((iterator_facade_base<llvm::StringMapIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_llvm::StringMapEntry<llvm::cl::Option_*>_*,_llvm::StringMapEntry<llvm::cl::Option_*>_&>
                           *)&E);
    OVar3 = llvm::cl::Option::getOptionHiddenFlag(pSVar4->second);
    if (OVar3 != ReallyHidden) {
      pSVar4 = llvm::
               iterator_facade_base<llvm::StringMapIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_llvm::StringMapEntry<llvm::cl::Option_*>_*,_llvm::StringMapEntry<llvm::cl::Option_*>_&>
               ::operator->((iterator_facade_base<llvm::StringMapIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_llvm::StringMapEntry<llvm::cl::Option_*>_*,_llvm::StringMapEntry<llvm::cl::Option_*>_&>
                             *)&E);
      OVar3 = llvm::cl::Option::getOptionHiddenFlag(pSVar4->second);
      if ((OVar3 != Hidden) || (ShowHidden)) {
        pSVar4 = llvm::
                 iterator_facade_base<llvm::StringMapIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_llvm::StringMapEntry<llvm::cl::Option_*>_*,_llvm::StringMapEntry<llvm::cl::Option_*>_&>
                 ::operator->((iterator_facade_base<llvm::StringMapIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_llvm::StringMapEntry<llvm::cl::Option_*>_*,_llvm::StringMapEntry<llvm::cl::Option_*>_&>
                               *)&E);
        llvm::SmallPtrSetImpl<llvm::cl::Option_*>::insert
                  (&local_188,(SmallPtrSetImpl<llvm::cl::Option_*> *)&I,pSVar4->second);
        if (((local_188.second ^ 0xffU) & 1) == 0) {
          pSVar4 = llvm::
                   iterator_facade_base<llvm::StringMapIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_llvm::StringMapEntry<llvm::cl::Option_*>_*,_llvm::StringMapEntry<llvm::cl::Option_*>_&>
                   ::operator->((iterator_facade_base<llvm::StringMapIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_llvm::StringMapEntry<llvm::cl::Option_*>_*,_llvm::StringMapEntry<llvm::cl::Option_*>_&>
                                 *)&E);
          SVar6 = llvm::StringMapEntry<llvm::cl::Option_*>::getKey(pSVar4);
          local_1b0 = SVar6.Data;
          local_1a0 = local_1b0;
          pSVar4 = llvm::
                   iterator_facade_base<llvm::StringMapIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_llvm::StringMapEntry<llvm::cl::Option_*>_*,_llvm::StringMapEntry<llvm::cl::Option_*>_&>
                   ::operator->((iterator_facade_base<llvm::StringMapIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_llvm::StringMapEntry<llvm::cl::Option_*>_*,_llvm::StringMapEntry<llvm::cl::Option_*>_&>
                                 *)&E);
          std::pair<const_char_*,_llvm::cl::Option_*>::pair<const_char_*,_llvm::cl::Option_*&,_true>
                    (&local_198,&local_1a0,&pSVar4->second);
          llvm::SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>::
          push_back(&Opts->
                     super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>
                    ,&local_198);
        }
      }
    }
    llvm::
    StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
    ::operator++(&E.
                  super_StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
                );
  }
  Start = (pair<const_char_*,_llvm::cl::Option_*> *)
          (Opts->super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>).
          super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>.
          super_SmallVectorBase.BeginX;
  pvVar1 = (Opts->super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>).
           super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>.
           super_SmallVectorBase.BeginX;
  sVar5 = llvm::SmallVectorBase::size((SmallVectorBase *)Opts);
  llvm::array_pod_sort<std::pair<char_const*,llvm::cl::Option*>*>
            (Start,(pair<const_char_*,_llvm::cl::Option_*> *)((long)pvVar1 + sVar5 * 0x10),
             OptNameCompare);
  llvm::SmallPtrSet<llvm::cl::Option_*,_32U>::~SmallPtrSet
            ((SmallPtrSet<llvm::cl::Option_*,_32U> *)&I);
  return;
}

Assistant:

static void sortOpts(StringMap<Option *> &OptMap,
                     SmallVectorImpl<std::pair<const char *, Option *>> &Opts,
                     bool ShowHidden) {
  SmallPtrSet<Option *, 32> OptionSet; // Duplicate option detection.

  for (StringMap<Option *>::iterator I = OptMap.begin(), E = OptMap.end();
       I != E; ++I) {
    // Ignore really-hidden options.
    if (I->second->getOptionHiddenFlag() == ReallyHidden)
      continue;

    // Unless showhidden is set, ignore hidden flags.
    if (I->second->getOptionHiddenFlag() == Hidden && !ShowHidden)
      continue;

    // If we've already seen this option, don't add it to the list again.
    if (!OptionSet.insert(I->second).second)
      continue;

    Opts.push_back(
        std::pair<const char *, Option *>(I->getKey().data(), I->second));
  }

  // Sort the options list alphabetically.
  array_pod_sort(Opts.begin(), Opts.end(), OptNameCompare);
}